

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  long lVar1;
  ConstevalFormatString<2U> wallet_fmt;
  bool bVar2;
  bool bVar3;
  DBErrors DVar4;
  CWallet *pwallet_00;
  DBErrors *pDVar5;
  CWallet *pwallet_01;
  bool *any_unordered_00;
  type this_00;
  WalletBatch *this_01;
  DBErrors *pDVar6;
  CWallet *in_RSI;
  long in_FS_OFFSET;
  int in_stack_0000004c;
  DatabaseBatch *in_stack_00000050;
  CWallet *in_stack_00000058;
  uint256 *hash;
  vector<uint256,_std::allocator<uint256>_> *__range1;
  bool has_last_client;
  iterator __end1;
  iterator __begin1;
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  DBErrors result;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  CWallet *in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe4b;
  int in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe60;
  undefined1 fOverwrite;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  DatabaseBatch *in_stack_fffffffffffffe70;
  CWallet *pCVar7;
  CWallet *in_stack_fffffffffffffe78;
  DatabaseBatch *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  CWallet *batch;
  DBErrors local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_fffffffffffffe28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_stack_fffffffffffffe60
             ,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
             (bool)in_stack_fffffffffffffe4b);
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
            ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
             in_stack_fffffffffffffe28);
  bVar2 = DatabaseBatch::Read<std::__cxx11::string,int>
                    (in_stack_fffffffffffffe80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
  CWallet::GetVersion(in_stack_fffffffffffffe38);
  wallet_fmt.fmt._4_4_ = in_stack_fffffffffffffeac;
  wallet_fmt.fmt._0_4_ = in_stack_fffffffffffffea8;
  CWallet::WalletLogPrintf<int,int>
            (in_stack_fffffffffffffe78,wallet_fmt,(int *)in_stack_fffffffffffffe70,
             (int *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator*
            ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
             in_stack_fffffffffffffe38);
  local_1c = LoadMinVersion((CWallet *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                            ,(DatabaseBatch *)in_stack_fffffffffffffe28);
  if (local_1c == LOAD_OK) {
    std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator*
              ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
               in_stack_fffffffffffffe38);
    local_1c = LoadWalletFlags(in_stack_fffffffffffffe38,
                               (DatabaseBatch *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if (local_1c == LOAD_OK) {
      std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator*
                ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
                 in_stack_fffffffffffffe38);
      LoadLegacyWalletRecords(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
      std::max<wallet::DBErrors>
                ((DBErrors *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (DBErrors *)in_stack_fffffffffffffe28);
      batch = in_RSI;
      pwallet_00 = (CWallet *)
                   std::
                   unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
                   operator*((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                              *)in_stack_fffffffffffffe38);
      LoadDescriptorWalletRecords
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 (int)((ulong)pwallet_00 >> 0x20));
      pDVar5 = std::max<wallet::DBErrors>
                         ((DBErrors *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (DBErrors *)in_stack_fffffffffffffe28);
      if (*pDVar5 == UNKNOWN_DESCRIPTOR) {
        local_1c = UNKNOWN_DESCRIPTOR;
      }
      else {
        pCVar7 = in_RSI;
        pwallet_01 = (CWallet *)
                     std::
                     unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ::operator*((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                  *)in_stack_fffffffffffffe38);
        DVar4 = LoadAddressBookRecords
                          (pCVar7,(DatabaseBatch *)
                                  CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        any_unordered_00 =
             (bool *)std::max<wallet::DBErrors>
                               ((DBErrors *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                (DBErrors *)in_stack_fffffffffffffe28);
        std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
        operator*((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
                  in_stack_fffffffffffffe38);
        LoadTxRecords(pwallet_01,(DatabaseBatch *)pCVar7,
                      (vector<uint256,_std::allocator<uint256>_> *)
                      CONCAT44(DVar4,in_stack_fffffffffffffea8),any_unordered_00);
        std::max<wallet::DBErrors>
                  ((DBErrors *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (DBErrors *)in_stack_fffffffffffffe28);
        pCVar7 = in_RSI;
        this_00 = std::
                  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
                  operator*((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                             *)in_stack_fffffffffffffe38);
        DVar4 = LoadActiveSPKMs(pwallet_00,(DatabaseBatch *)batch);
        pDVar5 = std::max<wallet::DBErrors>
                           ((DBErrors *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (DBErrors *)in_stack_fffffffffffffe28);
        this_01 = (WalletBatch *)
                  std::
                  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
                  operator*((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                             *)in_stack_fffffffffffffe38);
        LoadDecryptionKeys(pCVar7,(DatabaseBatch *)CONCAT44(DVar4,in_stack_fffffffffffffe68));
        pDVar6 = std::max<wallet::DBErrors>
                           ((DBErrors *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            (DBErrors *)in_stack_fffffffffffffe28);
        local_1c = *pDVar6;
        if (local_1c == LOAD_OK) {
          std::vector<uint256,_std::allocator<uint256>_>::begin
                    ((vector<uint256,_std::allocator<uint256>_> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          std::vector<uint256,_std::allocator<uint256>_>::end
                    ((vector<uint256,_std::allocator<uint256>_> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          while( true ) {
            bVar3 = __gnu_cxx::
                    operator==<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                              ((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                *)in_stack_fffffffffffffe38,
                               (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            fOverwrite = (undefined1)((ulong)pDVar5 >> 0x38);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
            ::operator*((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                         *)in_stack_fffffffffffffe28);
            in_stack_fffffffffffffe38 =
                 (CWallet *)
                 std::
                 unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                 ::at((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                       *)in_stack_fffffffffffffe38,
                      (key_type *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
            WriteTx(this_01,(CWalletTx *)in_RSI);
            __gnu_cxx::__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
            ::operator++((__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>
                          *)in_stack_fffffffffffffe28);
          }
          if (!bVar2) {
            std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
            operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        *)in_stack_fffffffffffffe28);
            DatabaseBatch::Write<std::__cxx11::string,int>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pCVar7,(int *)CONCAT44(DVar4,in_stack_fffffffffffffe68),
                       (bool)fOverwrite);
          }
          CWallet::UpgradeKeyMetadata(in_stack_fffffffffffffe38);
          CWallet::UpgradeDescriptorCache((CWallet *)CONCAT44(DVar4,in_stack_fffffffffffffe68));
        }
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe28);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}